

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoomDefs.c
# Opt level: O0

int get_roomdef(tgestate_t *state,room_t room_index,int offset)

{
  byte bVar1;
  int iVar2;
  int in_EDX;
  byte in_SIL;
  long in_RDI;
  int index;
  uint local_4;
  
  iVar2 = get_roomdef_shadow((uint)in_SIL,in_EDX);
  if (iVar2 < 0) {
    bVar1 = rooms_and_tunnels[(int)(in_SIL - 1)][in_EDX];
  }
  else {
    bVar1 = *(byte *)(in_RDI + 0x110 + (long)iVar2);
  }
  local_4 = (uint)bVar1;
  return local_4;
}

Assistant:

int get_roomdef(tgestate_t *state, room_t room_index, int offset)
{
  int index;

  index = get_roomdef_shadow(room_index, offset);
  if (index >= 0)
    /* Get the shadow byte where present. */
    return state->roomdef_shadow_bytes[index];
  else
    /* Fetch the real byte otherwise. */
    return rooms_and_tunnels[room_index - 1][offset]; /* array starts at 1 */
}